

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dependency.cpp
# Opt level: O2

void __thiscall Dependency::copyYourself(Dependency *this)

{
  int iVar1;
  ostream *poVar2;
  allocator local_f1;
  string local_f0;
  string command;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  getOriginalPath_abi_cxx11_(&command,this);
  getInstallPath_abi_cxx11_(&local_f0,this);
  copyFile(&command,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&command);
  std::__cxx11::string::string((string *)&local_70,"install_name_tool -id \"",&local_f1);
  getInnerPath_abi_cxx11_(&local_90,this);
  std::operator+(&local_50,&local_70,&local_90);
  std::operator+(&local_30,&local_50,"\" \"");
  getInstallPath_abi_cxx11_(&local_b0,this);
  std::operator+(&local_f0,&local_30,&local_b0);
  std::operator+(&command,&local_f0,"\"");
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  iVar1 = systemp(&command);
  if (iVar1 == 0) {
    std::__cxx11::string::~string((string *)&command);
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,
                           "\n\nError : An error occured while trying to change identity of library "
                          );
  getInstallPath_abi_cxx11_(&local_f0,this);
  poVar2 = std::operator<<(poVar2,(string *)&local_f0);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_f0);
  exit(1);
}

Assistant:

void Dependency::copyYourself()
{
    copyFile(getOriginalPath(), getInstallPath());
    
    // Fix the lib's inner name
    std::string command = std::string("install_name_tool -id \"") + getInnerPath() + "\" \"" + getInstallPath() + "\"";
    if( systemp( command ) != 0 )
    {
        std::cerr << "\n\nError : An error occured while trying to change identity of library " << getInstallPath() << std::endl;
        exit(1);
    }
}